

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testdict.c
# Opt level: O0

int test_dict(xmlDict *dict)

{
  undefined4 uVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *tmp;
  xmlChar *pref;
  xmlChar *cur;
  xmlChar prefix [40];
  int local_18;
  int ret;
  int j;
  int i;
  xmlDict *dict_local;
  
  prefix[0x24] = '\0';
  prefix[0x25] = '\0';
  prefix[0x26] = '\0';
  prefix[0x27] = '\0';
  memset(test1,0,8);
  for (ret = 0; ret < 10; ret = ret + 1) {
    pxVar3 = (xmlChar *)xmlDictLookup(dict,strings1[ret],0xffffffff);
    test1[ret] = pxVar3;
    if (test1[ret] == (xmlChar *)0x0) {
      fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[ret]);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
  }
  local_18 = 90000;
  for (ret = 0; ret < 10; ret = ret + 1) {
    pxVar3 = strings1[local_18];
    uVar1 = xmlStrlen(strings1[local_18]);
    pxVar3 = (xmlChar *)xmlDictLookup(dict,pxVar3,uVar1);
    test1[local_18] = pxVar3;
    if (test1[local_18] == (xmlChar *)0x0) {
      fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[local_18]);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
    local_18 = local_18 + 1;
  }
  local_18 = 0x18696;
  for (ret = 0; ret < 10; ret = ret + 1) {
    pxVar3 = strings1[local_18];
    uVar1 = xmlStrlen(strings1[local_18]);
    pxVar3 = (xmlChar *)xmlDictLookup(dict,pxVar3,uVar1);
    test1[local_18] = pxVar3;
    if (test1[local_18] == (xmlChar *)0x0) {
      fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[local_18]);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
    local_18 = local_18 + 1;
  }
  for (ret = 0; ret < 100000; ret = ret + 1) {
    if (test1[ret] == (xmlChar *)0x0) {
      pxVar3 = (xmlChar *)xmlDictLookup(dict,strings1[ret],0xffffffff);
      test1[ret] = pxVar3;
      if (test1[ret] == (xmlChar *)0x0) {
        fprintf(_stderr,"Failed lookup for \'%s\'\n",strings1[ret]);
        prefix[0x24] = '\x01';
        prefix[0x25] = '\0';
        prefix[0x26] = '\0';
        prefix[0x27] = '\0';
        nbErrors = nbErrors + 1;
      }
    }
  }
  for (ret = 0; ret < 100000; ret = ret + 1) {
    iVar2 = xmlDictOwns(dict,test1[ret]);
    if (iVar2 == 0) {
      fprintf(_stderr,"Failed ownership failure for \'%s\'\n",strings1[ret]);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
  }
  for (ret = 0; ret < 100000; ret = ret + 1) {
    pxVar3 = (xmlChar *)xmlDictLookup(dict,strings1[ret],0xffffffff);
    if (pxVar3 != test1[ret]) {
      fprintf(_stderr,"Failed re-lookup check for %d, \'%s\'\n",(ulong)(uint)ret,strings1[ret]);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
  }
  for (ret = 90000; ret < 100000; ret = ret + 1) {
    tmp = (xmlChar *)&cur;
    pref = strings1[ret];
    while (*pref != ':') {
      *tmp = *pref;
      tmp = tmp + 1;
      pref = pref + 1;
    }
    *tmp = '\0';
    pxVar3 = (xmlChar *)xmlDictQLookup(dict,&cur,pref + 1);
    if (pxVar3 != test1[ret]) {
      fprintf(_stderr,"Failed lookup check for \'%s\':\'%s\'\n",&cur,pref + 1);
      prefix[0x24] = '\x01';
      prefix[0x25] = '\0';
      prefix[0x26] = '\0';
      prefix[0x27] = '\0';
      nbErrors = nbErrors + 1;
    }
  }
  iVar2._0_1_ = prefix[0x24];
  iVar2._1_1_ = prefix[0x25];
  iVar2._2_1_ = prefix[0x26];
  iVar2._3_1_ = prefix[0x27];
  return iVar2;
}

Assistant:

static int
test_dict(xmlDict *dict) {
    int i, j;
    int ret = 0;
    xmlChar prefix[40];
    xmlChar *cur, *pref;
    const xmlChar *tmp;

    /* Cast to avoid buggy warning on MSVC. */
    memset((void *) test1, 0, sizeof(test1));

    /*
     * Fill in NB_STRINGS_MIN, at this point the dictionary should not grow
     * and we allocate all those doing the fast key computations
     */
    for (i = 0;i < NB_STRINGS_MIN;i++) {
        test1[i] = xmlDictLookup(dict, strings1[i], -1);
	if (test1[i] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }
    j = NB_STRINGS_MAX - NB_STRINGS_NS;
    /* ":foo" like strings1 */
    for (i = 0;i < NB_STRINGS_MIN;i++, j++) {
        test1[j] = xmlDictLookup(dict, strings1[j], xmlStrlen(strings1[j]));
	if (test1[j] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings1[j]);
	    ret = 1;
	    nbErrors++;
	}
    }
    /* "a:foo" like strings1 */
    j = NB_STRINGS_MAX - NB_STRINGS_MIN;
    for (i = 0;i < NB_STRINGS_MIN;i++, j++) {
        test1[j] = xmlDictLookup(dict, strings1[j], xmlStrlen(strings1[j]));
	if (test1[j] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings1[j]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * At this point allocate all the strings
     * the dictionary will grow in the process, reallocate more string tables
     * and switch to the better key generator
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (test1[i] != NULL)
	    continue;
	test1[i] = xmlDictLookup(dict, strings1[i], -1);
	if (test1[i] == NULL) {
	    fprintf(stderr, "Failed lookup for '%s'\n", strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * Now we can start to test things, first that all strings1 belongs to
     * the dict
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (!xmlDictOwns(dict, test1[i])) {
	    fprintf(stderr, "Failed ownership failure for '%s'\n",
	            strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * Then that another lookup to the string will return the same
     */
    for (i = 0;i < NB_STRINGS_MAX;i++) {
        if (xmlDictLookup(dict, strings1[i], -1) != test1[i]) {
	    fprintf(stderr, "Failed re-lookup check for %d, '%s'\n",
	            i, strings1[i]);
	    ret = 1;
	    nbErrors++;
	}
    }

    /*
     * More complex, check the QName lookups
     */
    for (i = NB_STRINGS_MAX - NB_STRINGS_NS;i < NB_STRINGS_MAX;i++) {
        cur = strings1[i];
	pref = &prefix[0];
	while (*cur != ':') *pref++ = *cur++;
	cur++;
	*pref = 0;
	tmp = xmlDictQLookup(dict, &prefix[0], cur);
	if (tmp != test1[i]) {
	    fprintf(stderr, "Failed lookup check for '%s':'%s'\n",
	            &prefix[0], cur);
            ret = 1;
	    nbErrors++;
	}
    }

    return(ret);
}